

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  XmlOutput *pXVar1;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_160;
  xml_output local_148;
  xml_output local_110;
  QArrayDataPointer<char16_t> local_d8;
  xml_output local_c0;
  QArrayDataPointer<char16_t> local_88;
  xml_output local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_88,"Tool");
  tag(&local_70,(QString *)&local_88);
  pXVar1 = XmlOutput::operator<<((XmlOutput *)CONCAT44(in_register_00000034,__fd),&local_70);
  QString::QString((QString *)&local_d8,"VCManifestTool");
  attrS(&local_c0,"Name",(QString *)&local_d8);
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_c0);
  attrT(&local_110,"EmbedManifest",*(triState *)((long)__buf + 8));
  pXVar1 = XmlOutput::operator<<(pXVar1,&local_110);
  QString::QString((QString *)&local_160,"Tool");
  closetag(&local_148,(QString *)&local_160);
  XmlOutput::operator<<(pXVar1,&local_148);
  XmlOutput::xml_output::~xml_output(&local_148);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_160);
  XmlOutput::xml_output::~xml_output(&local_110);
  XmlOutput::xml_output::~xml_output(&local_c0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
  XmlOutput::xml_output::~xml_output(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, const VCManifestTool &tool)
{
    xml << tag(_Tool)
        << attrS(_Name, _VCManifestTool)
        << attrT(_EmbedManifest, tool.EmbedManifest)
        << closetag(_Tool);
}